

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 this_00;
  int iVar3;
  char *pcVar4;
  string config;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  undefined1 local_70 [32];
  cmGeneratorExpression ge;
  
  cmCommonTargetGenerator::GetFlags
            (__return_storage_ptr__,&this->super_cmCommonTargetGenerator,language);
  iVar3 = std::__cxx11::string::compare((char *)language);
  if (iVar3 == 0) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source);
  }
  paVar1 = &config.field_2;
  config._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&config,"COMPILE_FLAGS","");
  pcVar4 = cmSourceFile::GetProperty(source,&config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)config._M_dataplus._M_p != paVar1) {
    operator_delete(config._M_dataplus._M_p,config.field_2._M_allocated_capacity + 1);
  }
  if (pcVar4 != (char *)0x0) {
    pcVar2 = (this->LocalGenerator->super_cmLocalCommonGenerator).ConfigName._M_dataplus._M_p;
    config._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&config,pcVar2,
               pcVar2 + (this->LocalGenerator->super_cmLocalCommonGenerator).ConfigName.
                        _M_string_length);
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_70);
    cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)local_70);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_70);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_70,(char *)&ge);
    this_00 = local_70._0_8_;
    local_70._0_8_ = (cmState *)0x0;
    cge.x_ = (cmCompiledGeneratorExpression *)this_00;
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_70);
    local_70._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
    local_70[0x10] = '\0';
    local_70._0_8_ = (cmState *)(local_70 + 0x10);
    pcVar4 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)this_00,
                        (cmLocalGenerator *)this->LocalGenerator,&config,false,
                        (this->super_cmCommonTargetGenerator).GeneratorTarget,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        (string *)local_70);
    if ((cmState *)local_70._0_8_ != (cmState *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_,CONCAT71(local_70._17_7_,local_70[0x10]) + 1);
    }
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      _vptr_cmLocalGenerator[7])(this->LocalGenerator,__return_storage_ptr__,pcVar4);
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)config._M_dataplus._M_p != &config.field_2) {
      operator_delete(config._M_dataplus._M_p,config.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeFlagsForObject(
  cmSourceFile const* source, const std::string& language)
{
  std::string flags = this->GetFlags(language);

  // Add Fortran format flags.
  if (language == "Fortran") {
    this->AppendFortranFormatFlags(flags, *source);
  }

  // Add source file specific flags.
  if (const char* cflags = source->GetProperty("COMPILE_FLAGS")) {
    std::string config = this->LocalGenerator->GetConfigName();
    cmGeneratorExpression ge;
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(cflags);
    const char* evaluatedFlags = cge->Evaluate(this->LocalGenerator, config,
                                               false, this->GeneratorTarget);
    this->LocalGenerator->AppendFlags(flags, evaluatedFlags);
  }

  return flags;
}